

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Bac_ManWriteVerilogNtk(Bac_Ntk_t *p,int fUseAssign)

{
  Vec_Int_t *p_00;
  Vec_Str_t *p_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Bac_NameType_t BVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  
  if ((p->vFanin).nSize != (p->vType).nSize) {
    __assert_fail("Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                  ,0x24b,"void Bac_ManWriteVerilogNtk(Bac_Ntk_t *, int)");
  }
  p_01 = p->pDesign->vOut;
  Vec_StrPrintStr(p_01,"module ");
  pcVar7 = Bac_NtkName(p);
  Vec_StrPrintStr(p_01,pcVar7);
  Vec_StrPrintStr(p_01," (\n    ");
  iVar10 = p_01->nSize;
  p_00 = &p->vInfo;
  for (iVar9 = 0; iVar9 + 2 < (p->vInfo).nSize; iVar9 = iVar9 + 3) {
    iVar2 = Vec_IntEntry(p_00,iVar9);
    Vec_IntEntry(p_00,iVar9 + 1);
    Vec_IntEntry(p_00,iVar9 + 2);
    iVar3 = Abc_Lit2Att2(iVar2);
    if (iVar3 != 0) {
      pcVar7 = "    \"%s\", ";
      if (iVar9 == 0) {
        pcVar7 = "T = %d\t\t";
      }
      Vec_StrPrintStr(p_01,pcVar7 + 8);
      iVar3 = p_01->nSize;
      if (iVar10 + 0x46 < iVar3) {
        Vec_StrPrintStr(p_01,"\n    ");
        iVar10 = iVar3;
      }
      iVar2 = Abc_Lit2Var2(iVar2);
      Bac_ManWriteVar(p,iVar2);
    }
  }
  Vec_StrPrintStr(p_01,"\n  );\n");
  for (iVar10 = 1; iVar10 + 1 < (p->vInfo).nSize; iVar10 = iVar10 + 3) {
    iVar9 = Vec_IntEntry(p_00,iVar10 + -1);
    iVar2 = Vec_IntEntry(p_00,iVar10);
    iVar3 = Vec_IntEntry(p_00,iVar10 + 1);
    iVar4 = Abc_Lit2Att2(iVar9);
    if (iVar4 != 0) {
      Vec_StrPrintStr(p_01,"  ");
      uVar5 = Abc_Lit2Att2(iVar9);
      Vec_StrPrintStr(p_01,&DAT_007a4480 + *(int *)(&DAT_007a4480 + (ulong)uVar5 * 4));
      if (-1 < iVar2) {
        Bac_ManWriteRange(p,iVar2,iVar3);
      }
      iVar9 = Abc_Lit2Var2(iVar9);
      Bac_ManWriteVar(p,iVar9);
      Vec_StrPrintStr(p_01,";\n");
    }
  }
  Vec_StrPrintStr(p_01,"\n");
  for (iVar10 = 0; iVar9 = (p->vType).nSize, iVar10 < iVar9; iVar10 = iVar10 + 1) {
    iVar9 = Bac_ObjIsBox(p,iVar10);
    if ((iVar9 != 0) && (iVar2 = Bac_ObjIsConst(p,iVar10), iVar9 = iVar10, iVar2 == 0)) {
      while ((iVar2 = iVar9, iVar9 = iVar2 + 1, iVar9 < (p->vType).nSize &&
             (iVar3 = Bac_ObjIsBo(p,iVar9), iVar3 != 0))) {
        BVar6 = Bac_ObjNameType(p,iVar9);
        if ((BVar6 == BAC_NAME_WORD) || (BVar6 = Bac_ObjNameType(p,iVar9), BVar6 == BAC_NAME_INFO))
        {
          Vec_StrPrintStr(p_01,"  wire ");
          iVar3 = Bac_ManFindRealIndex(p,iVar9);
          iVar4 = Bac_ObjGetRange(p,iVar9);
          iVar2 = Bac_ManFindRealIndex(p,iVar2 + iVar4);
          Bac_ManWriteRange(p,iVar3,iVar2);
          iVar2 = Bac_ManFindRealNameId(p,iVar9);
          Bac_ManWriteVar(p,iVar2);
          Vec_StrPrintStr(p_01,";\n");
        }
      }
    }
  }
  iVar10 = 0;
  bVar1 = false;
  do {
    if (iVar9 <= iVar10) {
      if (bVar1) {
        Vec_StrPrintStr(p_01,"\n  wire ");
        iVar10 = 7;
        for (iVar9 = 0; iVar9 < (p->vType).nSize; iVar9 = iVar9 + 1) {
          iVar2 = Bac_ObjIsBox(p,iVar9);
          if ((iVar2 != 0) && (iVar3 = Bac_ObjIsConst(p,iVar9), iVar2 = iVar9, iVar3 == 0)) {
            while ((iVar2 = iVar2 + 1, iVar2 < (p->vType).nSize &&
                   (iVar3 = Bac_ObjIsBo(p,iVar2), iVar3 != 0))) {
              BVar6 = Bac_ObjNameType(p,iVar2);
              if (BVar6 == BAC_NAME_BIN) {
                pcVar7 = ";\n  wire ";
                iVar3 = 7;
                if ((0x48 < iVar10) || (pcVar7 = ", ", iVar3 = iVar10, 7 < iVar10)) {
                  Vec_StrPrintStr(p_01,pcVar7);
                }
                pcVar7 = Bac_ObjNameStr(p,iVar2);
                Vec_StrPrintStr(p_01,pcVar7);
                pcVar7 = Bac_ObjNameStr(p,iVar2);
                sVar8 = strlen(pcVar7);
                iVar10 = (int)sVar8 + iVar3;
              }
            }
          }
        }
        Vec_StrPrintStr(p_01,";\n");
      }
      Vec_StrPrintStr(p_01,"\n");
      Bac_ManWriteVerilogBoxes(p,fUseAssign);
      Vec_StrPrintStr(p_01,"endmodule\n\n");
      return;
    }
    iVar9 = Bac_ObjIsBox(p,iVar10);
    if ((iVar9 != 0) && (iVar2 = Bac_ObjIsConst(p,iVar10), iVar9 = iVar10, iVar2 == 0)) {
      do {
        iVar9 = iVar9 + 1;
        if (((p->vType).nSize <= iVar9) || (iVar2 = Bac_ObjIsBo(p,iVar9), iVar2 == 0))
        goto LAB_00328637;
        BVar6 = Bac_ObjNameType(p,iVar9);
      } while (BVar6 != BAC_NAME_BIN);
      iVar10 = (p->vType).nSize;
      bVar1 = true;
    }
LAB_00328637:
    iVar10 = iVar10 + 1;
    iVar9 = (p->vType).nSize;
  } while( true );
}

Assistant:

void Bac_ManWriteVerilogNtk( Bac_Ntk_t * p, int fUseAssign )
{
    char * pKeyword[4] = { "wire ", "input ", "output ", "inout " };
    Vec_Str_t * vStr = p->pDesign->vOut;
    int k, iObj, iTerm, Value, Beg, End, Length, fHaveWires, StartPos;
//    assert( Bac_NtkInfoNum(p) );
    assert( Vec_IntSize(&p->vFanin) == Bac_NtkObjNum(p) );
//    Bac_NtkPrint( p );
    // write header
    Vec_StrPrintStr( vStr, "module " );
    Vec_StrPrintStr( vStr, Bac_NtkName(p) );
    Vec_StrPrintStr( vStr, " (\n    " );
    StartPos = Vec_StrSize(vStr);
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, k ? ", " : "" );
        if ( Vec_StrSize(vStr) > StartPos + 70 )
        {
            StartPos = Vec_StrSize(vStr);
            Vec_StrPrintStr( vStr, "\n    " );
        }
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
    }
    Vec_StrPrintStr( vStr, "\n  );\n" );
    // write inputs/outputs
    Vec_IntForEachEntryTriple( &p->vInfo, Value, Beg, End, k )
    if ( Abc_Lit2Att2(Value) != 0 )
    {
        Vec_StrPrintStr( vStr, "  " );
        Vec_StrPrintStr( vStr, pKeyword[Abc_Lit2Att2(Value)] );
        if ( Beg >= 0 )
            Bac_ManWriteRange( p, Beg, End );
        Bac_ManWriteVar( p, Abc_Lit2Var2(Value) );
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write word-level wires
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_WORD || Bac_ObjNameType(p, iTerm) == BAC_NAME_INFO )
        {
            Vec_StrPrintStr( vStr, "  wire " );
            Bac_ManWriteRange( p, Bac_ManFindRealIndex(p, iTerm), Bac_ManFindRealIndex(p, iTerm + Bac_ObjGetRange(p, iTerm) - 1) );
            Bac_ManWriteVar( p, Bac_ManFindRealNameId(p, iTerm) );
            Vec_StrPrintStr( vStr, ";\n" );
        }
    // check if there are any wires left
    fHaveWires = 0;
    Bac_NtkForEachBox( p, iObj )
    if ( !Bac_ObjIsConst(p, iObj) )
        Bac_BoxForEachBo( p, iObj, iTerm, k )
        if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
        { fHaveWires = 1; iObj = Bac_NtkObjNum(p); break; }
    // write bit-level wires
    if ( fHaveWires )
    {
        Length = 7;
        Vec_StrPrintStr( vStr, "\n  wire " );
        Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjIsConst(p, iObj) )
            Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) == BAC_NAME_BIN )
            {
                if ( Length > 72 )
                    Vec_StrPrintStr( vStr, ";\n  wire " ), Length = 7;
                if ( Length > 7 )
                    Vec_StrPrintStr( vStr, ", " );
                Vec_StrPrintStr( vStr, Bac_ObjNameStr(p, iTerm) ); 
                Length += strlen(Bac_ObjNameStr(p, iTerm));
            }
        Vec_StrPrintStr( vStr, ";\n" );
    }
    Vec_StrPrintStr( vStr, "\n" );
    // write objects
    Bac_ManWriteVerilogBoxes( p, fUseAssign );
    Vec_StrPrintStr( vStr, "endmodule\n\n" );
}